

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

UniquePtr<EC_KEY> __thiscall
anon_unknown.dwarf_263068::DecodeECPrivateKey
          (anon_unknown_dwarf_263068 *this,uint8_t *in,size_t in_len)

{
  bool bVar1;
  EC_KEY *__p;
  size_t sVar2;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_38;
  UniquePtr<EC_KEY> ret;
  CBS cbs;
  size_t in_len_local;
  uint8_t *in_local;
  
  CBS_init((CBS *)&ret,in,in_len);
  __p = EC_KEY_parse_private_key((CBS *)&ret,(EC_GROUP *)0x0);
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&local_38,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  if ((bVar1) && (sVar2 = CBS_len((CBS *)&ret), sVar2 == 0)) {
    std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)this,&local_38);
  }
  else {
    std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<EC_KEY> DecodeECPrivateKey(const uint8_t *in,
                                                  size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  bssl::UniquePtr<EC_KEY> ret(EC_KEY_parse_private_key(&cbs, NULL));
  if (!ret || CBS_len(&cbs) != 0) {
    return nullptr;
  }
  return ret;
}